

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-writer.cc
# Opt level: O3

void wabt::WriteOpcode(Stream *stream,Opcode opcode)

{
  Opcode local_5c;
  Info local_58;
  
  local_5c.enum_ = opcode.enum_;
  Opcode::GetInfo(&local_58,&local_5c);
  if (local_58.prefix == 0) {
    Opcode::GetInfo(&local_58,&local_5c);
    Opcode::GetInfo(&local_58,&local_5c);
    Stream::WriteU8(stream,local_58.code,local_58.name,No);
  }
  else {
    Opcode::GetInfo(&local_58,&local_5c);
    Stream::WriteU8(stream,(uint)local_58.prefix,"prefix",No);
    Opcode::GetInfo(&local_58,&local_5c);
    Opcode::GetInfo(&local_58,&local_5c);
    WriteU32Leb128(stream,local_58.code,local_58.name);
  }
  return;
}

Assistant:

void WriteOpcode(Stream* stream, Opcode opcode) {
  if (opcode.HasPrefix()) {
    stream->WriteU8(opcode.GetPrefix(), "prefix");
    WriteU32Leb128(stream, opcode.GetCode(), opcode.GetName());
  } else {
    stream->WriteU8(opcode.GetCode(), opcode.GetName());
  }
}